

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O0

BranchReloc * __thiscall
IRBuilderAsmJs::CreateRelocRecord
          (IRBuilderAsmJs *this,BranchInstr *branchInstr,uint32 offset,uint32 targetOffset)

{
  JitArenaAllocator *pJVar1;
  BranchReloc *this_00;
  TrackAllocData local_50;
  BranchReloc *local_28;
  BranchReloc *reloc;
  uint32 targetOffset_local;
  uint32 offset_local;
  BranchInstr *branchInstr_local;
  IRBuilderAsmJs *this_local;
  
  pJVar1 = this->m_tempAlloc;
  reloc._0_4_ = targetOffset;
  reloc._4_4_ = offset;
  _targetOffset_local = branchInstr;
  branchInstr_local = (BranchInstr *)this;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,(type_info *)&BranchReloc::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
             ,0x2b9);
  pJVar1 = (JitArenaAllocator *)
           Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                          pJVar1,&local_50);
  this_00 = (BranchReloc *)new<Memory::JitArenaAllocator>(0x18,pJVar1,0x4e98c0);
  BranchReloc::BranchReloc(this_00,_targetOffset_local,reloc._4_4_,(uint32)reloc);
  local_28 = this_00;
  SList<BranchReloc_*,_Memory::ArenaAllocator,_RealCount>::Prepend
            (this->m_branchRelocList,&local_28);
  return local_28;
}

Assistant:

BranchReloc *
IRBuilderAsmJs::CreateRelocRecord(IR::BranchInstr * branchInstr, uint32 offset, uint32 targetOffset)
{
    BranchReloc * reloc = JitAnew(m_tempAlloc, BranchReloc, branchInstr, offset, targetOffset);
    m_branchRelocList->Prepend(reloc);
    return reloc;
}